

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
compute_parents<bvh::v2::ParallelExecutor>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Executor<bvh::v2::ParallelExecutor> *executor,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh)

{
  ulong uVar1;
  ThreadPool *this;
  function<void_(unsigned_long)> *__stat_loc;
  ulong end;
  ulong uVar2;
  ulong uVar3;
  anon_class_16_2_7fbdbc5e local_88;
  anon_class_32_3_6bb9c804 local_78;
  function<void_(unsigned_long)> local_50;
  
  __stat_loc = (function<void_(unsigned_long)> *)
               (((long)(bvh->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(bvh->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x1c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(size_type)__stat_loc,(allocator_type *)&local_50);
  *(__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
   _M_impl.super__Vector_impl_data._M_start = 0;
  end = ((long)(bvh->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(bvh->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
  local_88.bvh = bvh;
  local_88.parents = __return_storage_ptr__;
  if (end < *(ulong *)(executor + 8)) {
    compute_parents<bvh::v2::ParallelExecutor>::anon_class_16_2_7fbdbc5e::operator()
              (&local_88,0,end);
  }
  else {
    uVar2 = end / (ulong)(*(long *)(*(long *)executor + 0x38) - *(long *)(*(long *)executor + 0x30)
                         >> 3);
    uVar3 = 0;
    while (uVar3 < end) {
      this = *(ThreadPool **)executor;
      uVar1 = uVar3 + uVar2 + (uVar2 == 0);
      local_78.next = end;
      if (uVar1 < end) {
        local_78.next = uVar1;
      }
      local_78.loop.bvh = local_88.bvh;
      local_78.loop.parents = local_88.parents;
      local_78.i = uVar3;
      std::function<void_(unsigned_long)>::
      function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_executor_h:58:30),_void>
                (&local_50,&local_78);
      __stat_loc = &local_50;
      ThreadPool::push(this,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      uVar3 = uVar1;
    }
    ThreadPool::wait(*(ThreadPool **)executor,__stat_loc);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> compute_parents(Executor<Derived>& executor, const Bvh<Node>& bvh) {
        std::vector<size_t> parents(bvh.nodes.size());
        parents[0] = 0;
        executor.for_each(0, bvh.nodes.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& node = bvh.nodes[i];
                    if (!node.is_leaf()) {
                        parents[node.index.first_id() + 0] = i;
                        parents[node.index.first_id() + 1] = i;
                    }
                }
            });
        return parents;
    }